

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

void LzmaEnc_Init(CLzmaEnc *p)

{
  uint uVar1;
  UInt16 *pUVar2;
  undefined1 auVar3 [16];
  long lVar4;
  uint uVar5;
  UInt16 (*paUVar6) [16];
  UInt16 (*paUVar7) [64];
  int iVar8;
  long lVar9;
  int iVar12;
  undefined1 auVar10 [16];
  int iVar13;
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar45;
  undefined1 auVar39 [16];
  int iVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar48 [16];
  
  lVar4 = 0;
  (p->rc).low = 0;
  p->reps[0] = 0;
  p->reps[1] = 0;
  p->reps[2] = 0;
  p->reps[3] = 0;
  p->state = 0;
  (p->rc).range = 0xffffffff;
  (p->rc).cacheSize = 1;
  (p->rc).cache = '\0';
  (p->rc).buf = (p->rc).bufBase;
  (p->rc).processed = 0;
  (p->rc).res = 0;
  paUVar6 = p->isRep0Long;
  do {
    lVar9 = 0;
    do {
      pUVar2 = paUVar6[-0xf] + lVar9;
      pUVar2[0] = 0x400;
      pUVar2[1] = 0x400;
      pUVar2[2] = 0x400;
      pUVar2[3] = 0x400;
      pUVar2[4] = 0x400;
      pUVar2[5] = 0x400;
      pUVar2[6] = 0x400;
      pUVar2[7] = 0x400;
      pUVar2 = *paUVar6 + lVar9;
      pUVar2[0] = 0x400;
      pUVar2[1] = 0x400;
      pUVar2[2] = 0x400;
      pUVar2[3] = 0x400;
      pUVar2[4] = 0x400;
      pUVar2[5] = 0x400;
      pUVar2[6] = 0x400;
      pUVar2[7] = 0x400;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x10);
    p->isRep[lVar4] = 0x400;
    p->isRepG0[lVar4] = 0x400;
    p->isRepG1[lVar4] = 0x400;
    p->isRepG2[lVar4] = 0x400;
    auVar3 = _DAT_00116440;
    lVar4 = lVar4 + 1;
    paUVar6 = paUVar6 + 1;
  } while (lVar4 != 0xc);
  uVar1 = p->lp;
  uVar5 = p->lc + uVar1;
  if (uVar5 < 0x18) {
    iVar8 = 0x300 << ((byte)uVar5 & 0x1f);
    pUVar2 = p->litProbs;
    uVar5 = iVar8 + (uint)(iVar8 == 0);
    lVar4 = (ulong)uVar5 - 1;
    auVar10._8_4_ = (int)lVar4;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar10 = auVar10 ^ _DAT_00116440;
    auVar20._8_4_ = 0xffffffff;
    auVar20._0_8_ = 0xffffffffffffffff;
    auVar20._12_4_ = 0xffffffff;
    auVar25 = _DAT_00116400;
    auVar15 = _DAT_00116410;
    auVar17 = _DAT_00116420;
    auVar19 = _DAT_00116430;
    do {
      auVar21 = auVar19 ^ auVar3;
      iVar8 = auVar10._0_4_;
      iVar38 = -(uint)(iVar8 < auVar21._0_4_);
      iVar12 = auVar10._4_4_;
      auVar22._4_4_ = -(uint)(iVar12 < auVar21._4_4_);
      iVar46 = auVar10._8_4_;
      iVar45 = -(uint)(iVar46 < auVar21._8_4_);
      iVar13 = auVar10._12_4_;
      auVar22._12_4_ = -(uint)(iVar13 < auVar21._12_4_);
      auVar32._4_4_ = iVar38;
      auVar32._0_4_ = iVar38;
      auVar32._8_4_ = iVar45;
      auVar32._12_4_ = iVar45;
      auVar47 = pshuflw(in_XMM12,auVar32,0xe8);
      auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar12);
      auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar13);
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar48 = pshuflw(in_XMM13,auVar30,0xe8);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar21 = pshuflw(auVar47,auVar22,0xe8);
      auVar21 = (auVar21 | auVar48 & auVar47) ^ auVar20;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4) = 0x400;
      }
      auVar22 = auVar30 & auVar32 | auVar22;
      auVar21 = packssdw(auVar22,auVar22);
      auVar21 = packssdw(auVar21 ^ auVar20,auVar21 ^ auVar20);
      if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 2) = 0x400;
      }
      auVar30 = auVar17 ^ auVar3;
      iVar38 = -(uint)(iVar8 < auVar30._0_4_);
      auVar39._4_4_ = -(uint)(iVar12 < auVar30._4_4_);
      iVar45 = -(uint)(iVar46 < auVar30._8_4_);
      auVar39._12_4_ = -(uint)(iVar13 < auVar30._12_4_);
      auVar21._4_4_ = iVar38;
      auVar21._0_4_ = iVar38;
      auVar21._8_4_ = iVar45;
      auVar21._12_4_ = iVar45;
      auVar31._4_4_ = -(uint)(auVar30._4_4_ == iVar12);
      auVar31._12_4_ = -(uint)(auVar30._12_4_ == iVar13);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar39._0_4_ = auVar39._4_4_;
      auVar39._8_4_ = auVar39._12_4_;
      auVar30 = auVar31 & auVar21 | auVar39;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packssdw(auVar30 ^ auVar20,auVar30 ^ auVar20);
      if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 4) = 0x400;
      }
      auVar21 = pshufhw(auVar21,auVar21,0x84);
      auVar32 = pshufhw(auVar31,auVar31,0x84);
      auVar22 = pshufhw(auVar21,auVar39,0x84);
      auVar21 = (auVar22 | auVar32 & auVar21) ^ auVar20;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 6) = 0x400;
      }
      auVar21 = auVar15 ^ auVar3;
      iVar38 = -(uint)(iVar8 < auVar21._0_4_);
      auVar24._4_4_ = -(uint)(iVar12 < auVar21._4_4_);
      iVar45 = -(uint)(iVar46 < auVar21._8_4_);
      auVar24._12_4_ = -(uint)(iVar13 < auVar21._12_4_);
      auVar33._4_4_ = iVar38;
      auVar33._0_4_ = iVar38;
      auVar33._8_4_ = iVar45;
      auVar33._12_4_ = iVar45;
      auVar30 = pshuflw(auVar30,auVar33,0xe8);
      auVar23._4_4_ = -(uint)(auVar21._4_4_ == iVar12);
      auVar23._12_4_ = -(uint)(auVar21._12_4_ == iVar13);
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar21 = pshuflw(auVar48 & auVar47,auVar23,0xe8);
      in_XMM13 = auVar21 & auVar30;
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar21 = pshuflw(auVar30,auVar24,0xe8);
      auVar21 = (auVar21 | in_XMM13) ^ auVar20;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 8) = 0x400;
      }
      auVar24 = auVar23 & auVar33 | auVar24;
      auVar21 = packssdw(auVar24,auVar24);
      auVar21 = packssdw(auVar21 ^ auVar20,auVar21 ^ auVar20);
      if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 10) = 0x400;
      }
      auVar21 = auVar25 ^ auVar3;
      iVar8 = -(uint)(iVar8 < auVar21._0_4_);
      auVar40._4_4_ = -(uint)(iVar12 < auVar21._4_4_);
      iVar46 = -(uint)(iVar46 < auVar21._8_4_);
      auVar40._12_4_ = -(uint)(iVar13 < auVar21._12_4_);
      auVar47._4_4_ = iVar8;
      auVar47._0_4_ = iVar8;
      auVar47._8_4_ = iVar46;
      auVar47._12_4_ = iVar46;
      auVar48._4_4_ = -(uint)(auVar21._4_4_ == iVar12);
      auVar48._12_4_ = -(uint)(auVar21._12_4_ == iVar13);
      auVar48._0_4_ = auVar48._4_4_;
      auVar48._8_4_ = auVar48._12_4_;
      auVar40._0_4_ = auVar40._4_4_;
      auVar40._8_4_ = auVar40._12_4_;
      auVar21 = auVar48 & auVar47 | auVar40;
      auVar21 = packssdw(auVar21,auVar21);
      in_XMM12 = packssdw(auVar21 ^ auVar20,auVar21 ^ auVar20);
      if ((in_XMM12 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 0xc) = 0x400;
      }
      auVar21 = pshufhw(auVar47,auVar47,0x84);
      auVar22 = pshufhw(auVar48,auVar48,0x84);
      auVar30 = pshufhw(auVar21,auVar40,0x84);
      auVar21 = (auVar30 | auVar22 & auVar21) ^ auVar20;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pUVar2 + lVar4 + 0xe) = 0x400;
      }
      lVar9 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 8;
      auVar19._8_8_ = lVar9 + 8;
      lVar9 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 8;
      auVar17._8_8_ = lVar9 + 8;
      lVar9 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar9 + 8;
      lVar9 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 8;
      auVar25._8_8_ = lVar9 + 8;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uVar5 + 7 & 0xffffff08) * 2 != lVar4);
  }
  paUVar7 = p->posSlotEncoder;
  lVar4 = 0;
  do {
    lVar9 = 0;
    do {
      pUVar2 = *paUVar7 + lVar9;
      pUVar2[0] = 0x400;
      pUVar2[1] = 0x400;
      pUVar2[2] = 0x400;
      pUVar2[3] = 0x400;
      pUVar2[4] = 0x400;
      auVar3 = _DAT_00116440;
      pUVar2[5] = 0x400;
      pUVar2[6] = 0x400;
      pUVar2[7] = 0x400;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x40);
    lVar4 = lVar4 + 1;
    paUVar7 = paUVar7 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  auVar11 = _DAT_00116400;
  auVar14 = _DAT_00116410;
  auVar16 = _DAT_00116420;
  auVar18 = _DAT_00116430;
  do {
    auVar25 = auVar18 ^ auVar3;
    iVar8 = auVar25._0_4_;
    iVar12 = auVar25._8_4_;
    auVar34._4_4_ = iVar8;
    auVar34._0_4_ = iVar8;
    auVar34._8_4_ = iVar12;
    auVar34._12_4_ = iVar12;
    auVar41._0_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar41._4_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar41._8_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar41._12_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar26._0_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar41;
    auVar25 = pshuflw(auVar34,auVar26,0xe8);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4] = 0x400;
    }
    auVar25 = packssdw(auVar26,auVar26);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
      p->posEncoders[lVar4 + 1] = 0x400;
    }
    auVar25 = auVar16 ^ auVar3;
    iVar8 = auVar25._0_4_;
    iVar12 = auVar25._8_4_;
    auVar35._4_4_ = iVar8;
    auVar35._0_4_ = iVar8;
    auVar35._8_4_ = iVar12;
    auVar35._12_4_ = iVar12;
    auVar42._0_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar42._4_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar42._8_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar42._12_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar27._0_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar42;
    auVar25 = packssdw(auVar35,auVar27);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 2] = 0x400;
    }
    auVar25 = pshufhw(auVar27,auVar27,0x84);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 3] = 0x400;
    }
    auVar25 = auVar14 ^ auVar3;
    iVar8 = auVar25._0_4_;
    iVar12 = auVar25._8_4_;
    auVar36._4_4_ = iVar8;
    auVar36._0_4_ = iVar8;
    auVar36._8_4_ = iVar12;
    auVar36._12_4_ = iVar12;
    auVar43._0_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar43._4_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar43._8_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar43._12_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar28._0_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar28._4_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar28._8_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar28._12_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar28 = auVar28 & auVar43;
    auVar25 = pshuflw(auVar36,auVar28,0xe8);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 4] = 0x400;
    }
    auVar25 = packssdw(auVar28,auVar28);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 5] = 0x400;
    }
    auVar25 = auVar11 ^ auVar3;
    iVar8 = auVar25._0_4_;
    iVar12 = auVar25._8_4_;
    auVar37._4_4_ = iVar8;
    auVar37._0_4_ = iVar8;
    auVar37._8_4_ = iVar12;
    auVar37._12_4_ = iVar12;
    auVar44._0_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar44._4_4_ = -(uint)(iVar8 < -0x7fffff8e);
    auVar44._8_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar44._12_4_ = -(uint)(iVar12 < -0x7fffff8e);
    auVar29._0_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar29._4_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar29._8_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar29._12_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar29 = auVar29 & auVar44;
    auVar25 = packssdw(auVar37,auVar29);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 6] = 0x400;
    }
    auVar25 = pshufhw(auVar29,auVar29,0x84);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      p->posEncoders[lVar4 + 7] = 0x400;
    }
    lVar4 = lVar4 + 8;
    lVar9 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 8;
    auVar18._8_8_ = lVar9 + 8;
    lVar9 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 8;
    auVar16._8_8_ = lVar9 + 8;
    lVar9 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 8;
    auVar14._8_8_ = lVar9 + 8;
    lVar9 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 8;
    auVar11._8_8_ = lVar9 + 8;
  } while (lVar4 != 0x78);
  (p->lenEnc).p.choice = 0x400;
  (p->lenEnc).p.choice2 = 0x400;
  lVar4 = 0;
  do {
    pUVar2 = (p->lenEnc).p.low + lVar4;
    pUVar2[0] = 0x400;
    pUVar2[1] = 0x400;
    pUVar2[2] = 0x400;
    pUVar2[3] = 0x400;
    pUVar2[4] = 0x400;
    pUVar2[5] = 0x400;
    pUVar2[6] = 0x400;
    pUVar2[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar2 = (p->lenEnc).p.mid + lVar4;
    pUVar2[0] = 0x400;
    pUVar2[1] = 0x400;
    pUVar2[2] = 0x400;
    pUVar2[3] = 0x400;
    pUVar2[4] = 0x400;
    pUVar2[5] = 0x400;
    pUVar2[6] = 0x400;
    pUVar2[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar2 = (p->lenEnc).p.high + lVar4;
    pUVar2[0] = 0x400;
    pUVar2[1] = 0x400;
    pUVar2[2] = 0x400;
    pUVar2[3] = 0x400;
    pUVar2[4] = 0x400;
    pUVar2[5] = 0x400;
    pUVar2[6] = 0x400;
    pUVar2[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x100);
  (p->repLenEnc).p.choice = 0x400;
  (p->repLenEnc).p.choice2 = 0x400;
  lVar4 = 0;
  do {
    pUVar2 = (p->repLenEnc).p.low + lVar4;
    pUVar2[0] = 0x400;
    pUVar2[1] = 0x400;
    pUVar2[2] = 0x400;
    pUVar2[3] = 0x400;
    pUVar2[4] = 0x400;
    pUVar2[5] = 0x400;
    pUVar2[6] = 0x400;
    pUVar2[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar2 = (p->repLenEnc).p.mid + lVar4;
    pUVar2[0] = 0x400;
    pUVar2[1] = 0x400;
    pUVar2[2] = 0x400;
    pUVar2[3] = 0x400;
    pUVar2[4] = 0x400;
    pUVar2[5] = 0x400;
    pUVar2[6] = 0x400;
    pUVar2[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  lVar4 = 0;
  do {
    pUVar2 = (p->repLenEnc).p.high + lVar4;
    pUVar2[0] = 0x400;
    pUVar2[1] = 0x400;
    pUVar2[2] = 0x400;
    pUVar2[3] = 0x400;
    pUVar2[4] = 0x400;
    pUVar2[5] = 0x400;
    pUVar2[6] = 0x400;
    pUVar2[7] = 0x400;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x100);
  p->posAlignEncoder[0] = 0x400;
  p->posAlignEncoder[1] = 0x400;
  p->posAlignEncoder[2] = 0x400;
  p->posAlignEncoder[3] = 0x400;
  p->posAlignEncoder[4] = 0x400;
  p->posAlignEncoder[5] = 0x400;
  p->posAlignEncoder[6] = 0x400;
  p->posAlignEncoder[7] = 0x400;
  p->posAlignEncoder[8] = 0x400;
  p->posAlignEncoder[9] = 0x400;
  p->posAlignEncoder[10] = 0x400;
  p->posAlignEncoder[0xb] = 0x400;
  p->posAlignEncoder[0xc] = 0x400;
  p->posAlignEncoder[0xd] = 0x400;
  p->posAlignEncoder[0xe] = 0x400;
  p->posAlignEncoder[0xf] = 0x400;
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = ~(-1 << ((byte)p->pb & 0x1f));
  p->lpMask = ~(-1 << ((byte)uVar1 & 0x1f));
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc *p)
{
  UInt32 i;
  p->state = 0;
  for (i = 0 ; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);


  for (i = 0; i < kNumStates; i++)
  {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++)
    {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = (UInt32)0x300 << (p->lp + p->lc);
    CLzmaProb *probs = p->litProbs;
    for (i = 0; i < num; i++)
      probs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++)
    {
      CLzmaProb *probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}